

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user.c
# Opt level: O0

int linux_evfilt_user_copyout(kevent *dst,int nevents,filter *filt,knote *src,void *ptr)

{
  int iVar1;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RDI;
  filter *in_R8;
  knote *in_stack_ffffffffffffffc8;
  int local_4;
  
  *in_RDI = *in_RCX;
  in_RDI[1] = in_RCX[1];
  in_RDI[2] = in_RCX[2];
  in_RDI[3] = in_RCX[3];
  *(uint *)((long)in_RDI + 0xc) = *(uint *)((long)in_RDI + 0xc) & 0x3fffffff;
  *(uint *)((long)in_RDI + 0xc) = *(uint *)((long)in_RDI + 0xc) & 0xfeffffff;
  if ((*(ushort *)((long)in_RCX + 10) & 0x20) != 0) {
    *(uint *)((long)in_RCX + 0xc) = *(uint *)((long)in_RCX + 0xc) & 0xfeffffff;
  }
  if (((*(ushort *)((long)in_RCX + 10) & 0xb0) == 0) ||
     (iVar1 = eventfd_lower((int)((ulong)in_RDX >> 0x20)), -1 < iVar1)) {
    if ((*(ushort *)((long)in_RCX + 10) & 0x80) != 0) {
      *(uint *)((long)in_RCX + 0xc) = *(uint *)((long)in_RCX + 0xc) & 0xfeffffff;
    }
    iVar1 = knote_copyout_flag_actions(in_R8,in_stack_ffffffffffffffc8);
    if (iVar1 < 0) {
      local_4 = -1;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int
linux_evfilt_user_copyout(struct kevent *dst, UNUSED int nevents, struct filter *filt,
    struct knote *src, void *ptr UNUSED)
{
    memcpy(dst, &src->kev, sizeof(*dst));
    dst->fflags &= ~NOTE_FFCTRLMASK;     //FIXME: Not sure if needed
    dst->fflags &= ~NOTE_TRIGGER;
    if (src->kev.flags & EV_CLEAR)
        src->kev.fflags &= ~NOTE_TRIGGER;
    if (src->kev.flags & (EV_DISPATCH | EV_CLEAR | EV_ONESHOT)) {
        if (eventfd_lower(src->kn_eventfd) < 0)
            return (-1);
    }

    if (src->kev.flags & EV_DISPATCH)
        src->kev.fflags &= ~NOTE_TRIGGER;

    if (knote_copyout_flag_actions(filt, src) < 0) return -1;

    return (1);
}